

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shuffling.hpp
# Opt level: O2

void Shell::Shuffling::shuffleList<unsigned_int>(List<unsigned_int> **list)

{
  uint len;
  uint uVar1;
  List<unsigned_int> *pLVar2;
  List<unsigned_int> **ppLVar3;
  ulong uVar4;
  DArray<Lib::List<unsigned_int>_*> aux;
  DArray<Lib::List<unsigned_int>_*> DStack_38;
  
  len = Lib::List<unsigned_int>::length(*list);
  if (1 < len) {
    Lib::DArray<Lib::List<unsigned_int>_*>::DArray(&DStack_38,(ulong)len);
    uVar1 = 0;
    ppLVar3 = list;
    while (pLVar2 = *ppLVar3, pLVar2 != (List<unsigned_int> *)0x0) {
      uVar4 = (ulong)uVar1;
      uVar1 = uVar1 + 1;
      DStack_38._array[uVar4] = pLVar2;
      ppLVar3 = &pLVar2->_tail;
    }
    shuffleArray<Lib::DArray<Lib::List<unsigned_int>*>>(&DStack_38,len);
    pLVar2 = (List<unsigned_int> *)0x0;
    for (uVar4 = 0; len != uVar4; uVar4 = uVar4 + 1) {
      pLVar2 = Lib::List<unsigned_int>::cons(DStack_38._array[uVar4]->_head,pLVar2);
    }
    *list = pLVar2;
    Lib::DArray<Lib::List<unsigned_int>_*>::~DArray(&DStack_38);
  }
  return;
}

Assistant:

static void shuffleList(List<T>*& list) {
    unsigned len = List<T>::length(list);

    if (len <= 1) {
      return;
    }

    DArray<List<T>*> aux(len);
    unsigned idx = 0;

    List<T>* els = list;
    while (els != nullptr) {
      aux[idx++] = els;
      els = els->tail();
    }
    shuffleArray(aux,len);

    // create the new list
    List<T>* res = nullptr;
    for(idx = 0; idx < len; idx++) {
      res = List<T>::cons(aux[idx]->head(),res);
    }

    // List<T>::destroy(list);
    list = res;
  }